

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_TextStyle * Internal_ByParentTextStyle(void)

{
  ON_UUID id;
  ON_TextStyle *in_RDI;
  ON_UUID ByParent_text_style_id;
  ON_TextStyle *text_style;
  
  ON_TextStyle::ON_TextStyle(in_RDI);
  id.Data4[0] = 0x92;
  id.Data4[1] = 200;
  id.Data4[2] = 0xbd;
  id.Data4[3] = '2';
  id.Data4[4] = 0x8e;
  id.Data4[5] = '#';
  id.Data4[6] = 0xc4;
  id.Data4[7] = 0x9f;
  id.Data1 = 0x4d82affa;
  id.Data2 = 0x433;
  id.Data3 = 0x4ce0;
  Internal_TextStyleInit(L"By Parent",id,-3,(ON_Font *)0x0,in_RDI);
  return in_RDI;
}

Assistant:

static ON_TextStyle Internal_ByParentTextStyle()
{
  // {4D82AFFA-0433-4CE0-92C8-BD328E23C49F}
  const ON_UUID ByParent_text_style_id =
  { 0x4d82affa, 0x433, 0x4ce0,{ 0x92, 0xc8, 0xbd, 0x32, 0x8e, 0x23, 0xc4, 0x9f } };

  ON_TextStyle text_style;
  Internal_TextStyleInit(L"By Parent", ByParent_text_style_id, -3, nullptr, text_style);
  return text_style;
}